

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O3

bool __thiscall
Am_Object_Data::notify_unique(Am_Object_Data *this,Am_Slot_Key key,Am_Wrapper *new_value)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  ushort uVar4;
  long lVar5;
  byte bVar6;
  Am_Object_Data *pAVar7;
  
  uVar1 = (this->data).length;
  if (uVar1 != 0) {
    lVar5 = 0;
    do {
      lVar2 = *(long *)((this->data).data + lVar5 * 8);
      if (*(Am_Slot_Key *)(lVar2 + 0x30) == key) {
        uVar4 = *(ushort *)(lVar2 + 0x38);
        if ((uVar4 & 2) == 0) {
          return true;
        }
        if (new_value != (Am_Wrapper *)0x0) {
          new_value->refs = new_value->refs + 1;
          uVar4 = *(ushort *)(lVar2 + 0x38);
        }
        *(Am_Wrapper **)(lVar2 + 8) = new_value;
        if ((uVar4 & 1) == 0) {
          return false;
        }
        pAVar7 = this->first_instance;
        if (pAVar7 != (Am_Object_Data *)0x0) {
          bVar6 = 1;
          do {
            bVar3 = notify_unique(pAVar7,key,new_value);
            bVar6 = bVar6 & bVar3;
            pAVar7 = pAVar7->next_instance;
          } while (pAVar7 != (Am_Object_Data *)0x0);
          if (bVar6 == 0) {
            return false;
          }
          uVar4 = *(ushort *)(lVar2 + 0x38);
        }
        *(ushort *)(lVar2 + 0x38) = uVar4 & 0xfffe;
        return false;
      }
      lVar5 = lVar5 + 1;
    } while (uVar1 != (uint)lVar5);
  }
  for (pAVar7 = this->first_instance; pAVar7 != (Am_Object_Data *)0x0;
      pAVar7 = pAVar7->next_instance) {
    notify_unique(pAVar7,key,new_value);
  }
  return false;
}

Assistant:

bool
Am_Object_Data::notify_unique(Am_Slot_Key key, Am_Wrapper *new_value)
{
  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = data.length, slot_array = (Am_Slot_Data **)data.data; i > 0;
       --i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key) {
      if (slot->flags & BIT_INHERITS) {
        if (new_value)
          new_value->Note_Reference();
        slot->value.wrapper_value = new_value;
        if (slot->flags & BIT_IS_INHERITED)
          if (propagate_unique(key, new_value))
            slot->flags &= ~BIT_IS_INHERITED;
        return false;
      } else
        return true;
    }
  }
  propagate_unique(key, new_value);
  return false;
}